

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamReaderPrivate::startDocument(QXmlStreamReaderPrivate *this)

{
  int iVar1;
  ushort uVar2;
  QString *pQVar3;
  Attribute *pAVar4;
  Interface *pIVar5;
  bool bVar6;
  Data *pDVar7;
  undefined1 auVar8 [8];
  char16_t *pcVar9;
  qsizetype qVar10;
  bool bVar11;
  char16_t *pcVar12;
  qsizetype qVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  storage_type_conflict *extraout_RDX_00;
  storage_type_conflict *extraout_RDX_01;
  storage_type_conflict *psVar17;
  long lVar18;
  Interface *data;
  ulong uVar19;
  QXmlUtils *this_00;
  long lVar20;
  ulong uVar21;
  char *__s;
  long lVar22;
  long in_FS_OFFSET;
  QStringView encName;
  QAnyStringView name;
  QStringView rhs;
  QStringView rhs_00;
  QByteArrayView in;
  QStringView rhs_01;
  QStringView rhs_02;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QStringView rhs_03;
  QAnyStringView a_02;
  QLatin1StringView lhs;
  QStringView haystack0;
  QLatin1StringView lhs_00;
  QLatin1StringView lhs_01;
  QLatin1StringView lhs_02;
  QLatin1StringView lhs_03;
  QStringView needle0;
  long local_100;
  QString local_d0;
  QString local_b8;
  QString local_98;
  undefined1 local_78 [8];
  State SStack_70;
  long local_38;
  storage_type_conflict *extraout_RDX;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  pQVar3 = (this->documentVersion).m_string;
  if (pQVar3 == (QString *)0x0) {
    pcVar12 = (char16_t *)0x0;
  }
  else {
    pcVar12 = (pQVar3->d).ptr;
    if (pcVar12 == (char16_t *)0x0) {
      pcVar12 = L"";
    }
    pcVar12 = pcVar12 + (this->documentVersion).m_pos;
  }
  lVar20 = (this->documentVersion).m_size;
  lVar22 = lVar20;
  if (pQVar3 == (QString *)0x0) {
    lVar22 = 0;
  }
  if ((lVar22 != 3) ||
     (rhs.m_data = pcVar12, rhs.m_size = 3, lhs.m_data = "1.0", lhs.m_size = 3,
     bVar11 = QtPrivate::equalStrings(lhs,rhs), !bVar11)) {
    if (pQVar3 == (QString *)0x0) {
      lVar20 = 0;
      pcVar12 = (char16_t *)0x0;
    }
    else {
      pcVar12 = (pQVar3->d).ptr;
      if (pcVar12 == (char16_t *)0x0) {
        pcVar12 = L"";
      }
      pcVar12 = pcVar12 + (this->documentVersion).m_pos;
    }
    local_78._0_2_ = 0x20;
    haystack0.m_data = pcVar12;
    haystack0.m_size = lVar20;
    needle0.m_data = (storage_type_conflict *)local_78;
    needle0.m_size = 1;
    qVar13 = QtPrivate::findString(haystack0,0,needle0,CaseSensitive);
    if (qVar13 == -1) {
      QCoreApplication::translate
                ((QString *)local_78,"QXmlStream","Unsupported XML version.",(char *)0x0,-1);
    }
    else {
      QCoreApplication::translate
                ((QString *)local_78,"QXmlStream","Invalid XML version string.",(char *)0x0,-1);
    }
    qVar13 = SStack_70.remainingChars;
    auVar8 = local_78;
    pcVar12 = local_98.d.ptr;
    pDVar7 = local_98.d.d;
    local_78 = (undefined1  [8])local_98.d.d;
    local_98.d.d = (Data *)auVar8;
    local_98.d.ptr = (char16_t *)SStack_70._0_8_;
    SStack_70._0_8_ = pcVar12;
    SStack_70.remainingChars = local_98.d.size;
    local_98.d.size = qVar13;
    if ((Interface *)pDVar7 != (Interface *)0x0) {
      LOCK();
      *(int *)&pDVar7->super_QArrayData = *(int *)&pDVar7->super_QArrayData + -1;
      UNLOCK();
      if (*(int *)&pDVar7->super_QArrayData == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
      }
    }
  }
  lVar20 = (this->attributeStack).tos;
  bVar11 = local_98.d.ptr == (char16_t *)0x0;
  if (-1 < lVar20 && bVar11) {
    lVar22 = 0x28;
    local_100 = 0;
    do {
      pAVar4 = (this->attributeStack).data;
      uVar2 = *(ushort *)((long)pAVar4 + lVar22 + -0x18);
      uVar19 = (ulong)(short)uVar2;
      lVar18 = *(long *)((long)pAVar4 + lVar22 + -0x28) + uVar19;
      uVar21 = *(long *)((long)pAVar4 + lVar22 + -0x20) - uVar19;
      lVar16 = (long)*(short *)((long)&(pAVar4->key).pos + lVar22);
      lVar14 = *(long *)((long)pAVar4 + lVar22 + -0x10) + lVar16;
      this_00 = (QXmlUtils *)(*(long *)((long)pAVar4 + lVar22 + -8) - lVar16);
      if (1 < uVar19) goto LAB_0039c195;
      if (uVar21 == 8) {
        pcVar12 = (this->textBuffer).d.ptr;
        if (pcVar12 == (char16_t *)0x0) {
          pcVar12 = L"";
        }
        rhs_00.m_data = pcVar12 + lVar18;
        rhs_00.m_size = 8;
        lhs_00.m_data = "encoding";
        lhs_00.m_size = 8;
        bVar11 = QtPrivate::equalStrings(lhs_00,rhs_00);
        if (!bVar11) goto LAB_0039c0d6;
        (this->documentEncoding).m_string = &this->textBuffer;
        (this->documentEncoding).m_pos = lVar14;
        (this->documentEncoding).m_size = (qsizetype)this_00;
        psVar17 = extraout_RDX;
        if ((this->field_0x3a9 & 0x20) != 0) {
          QCoreApplication::translate
                    ((QString *)local_78,"QXmlStream",
                     "The standalone pseudo attribute must appear after the encoding.",(char *)0x0,
                     -1);
          qVar13 = SStack_70.remainingChars;
          auVar8 = local_78;
          pcVar12 = local_98.d.ptr;
          pDVar7 = local_98.d.d;
          local_78 = (undefined1  [8])local_98.d.d;
          local_98.d.d = (Data *)auVar8;
          local_98.d.ptr = (char16_t *)SStack_70._0_8_;
          SStack_70._0_8_ = pcVar12;
          SStack_70.remainingChars = local_98.d.size;
          local_98.d.size = qVar13;
          psVar17 = extraout_RDX_00;
          if ((Interface *)pDVar7 != (Interface *)0x0) {
            LOCK();
            *(int *)&pDVar7->super_QArrayData = *(int *)&pDVar7->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&pDVar7->super_QArrayData == 0) {
              QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
              psVar17 = extraout_RDX_01;
            }
          }
        }
        pcVar12 = (this->textBuffer).d.ptr;
        if (pcVar12 == (char16_t *)0x0) {
          pcVar12 = L"";
        }
        encName.m_data = psVar17;
        encName.m_size = (qsizetype)(pcVar12 + lVar14);
        bVar11 = QXmlUtils::isEncName(this_00,encName);
        if (bVar11) {
          local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pcVar12 = (this->textBuffer).d.ptr;
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = L"";
          }
          QString::QString((QString *)local_78,(QChar *)(pcVar12 + lVar14),(qsizetype)this_00);
          QString::toUtf8_helper((QByteArray *)&local_b8,(QString *)local_78);
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)(char **)local_78 = *(int *)(char **)local_78 + -1;
            UNLOCK();
            if (*(int *)(char **)local_78 == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if ((this->field_0x3a9 & 8) == 0) {
            __s = (char *)local_b8.d.ptr;
            if (local_b8.d.ptr == (char16_t *)0x0) {
              __s = "";
            }
            sVar15 = strlen(__s);
            name.m_size = sVar15;
            name.field_0.m_data_utf8 = __s;
            QStringConverter::QStringConverter((QStringConverter *)local_78,name,(Flags)0x0);
            (this->decoder).super_QStringConverter.iface = (Interface *)local_78;
            QStringConverterBase::State::clear(&(this->decoder).super_QStringConverter.state);
            (this->decoder).super_QStringConverter.state.flags.
            super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
            super_QFlagsStorage<QStringConverterBase::Flag>.i =
                 (Int)SStack_70.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                      super_QFlagsStorage<QStringConverterBase::Flag>.i;
            (this->decoder).super_QStringConverter.state.remainingChars = SStack_70.remainingChars;
            (this->decoder).super_QStringConverter.state.invalidChars = SStack_70.invalidChars;
            (this->decoder).super_QStringConverter.state.field_4.d[0] = SStack_70.field_4.d[0];
            (this->decoder).super_QStringConverter.state.field_4.d[1] = SStack_70.field_4.d[1];
            (this->decoder).super_QStringConverter.state.clearFn = SStack_70.clearFn;
            SStack_70.clearFn = (ClearDataFn)0x0;
            QStringConverterBase::State::clear(&SStack_70);
            if ((this->decoder).super_QStringConverter.iface == (Interface *)0x0) {
              QCoreApplication::translate
                        (&local_d0,"QXmlStream","Encoding %1 is unsupported",(char *)0x0,-1);
              pcVar12 = (this->textBuffer).d.ptr;
              if (pcVar12 == (char16_t *)0x0) {
                pcVar12 = L"";
              }
              a_02.m_size = (ulong)this_00 | 0x8000000000000000;
              a_02.field_0.m_data_utf16 = pcVar12 + lVar14;
              QString::arg_impl((QString *)local_78,&local_d0,a_02,0,(QChar)0x20);
              qVar13 = SStack_70.remainingChars;
              auVar8 = local_78;
              pcVar12 = local_98.d.ptr;
              pDVar7 = local_98.d.d;
              local_78 = (undefined1  [8])local_98.d.d;
              local_98.d.d = (Data *)auVar8;
              local_98.d.ptr = (char16_t *)SStack_70._0_8_;
              SStack_70._0_8_ = pcVar12;
              SStack_70.remainingChars = local_98.d.size;
              local_98.d.size = qVar13;
              if ((Interface *)pDVar7 != (Interface *)0x0) {
                LOCK();
                *(int *)&pDVar7->super_QArrayData = *(int *)&pDVar7->super_QArrayData + -1;
                UNLOCK();
                if (*(int *)&pDVar7->super_QArrayData == 0) {
                  QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                }
              }
              if ((Interface *)local_d0.d.d != (Interface *)0x0) {
                LOCK();
                ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                iVar1 = ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i;
                UNLOCK();
                pIVar5 = (Interface *)local_d0.d.d;
                goto joined_r0x0039c56e;
              }
            }
            else {
              in.m_data = (this->rawReadBuffer).d.ptr;
              in.m_size = this->nbytesread;
              QStringDecoder::decodeAsString((QString *)local_78,&this->decoder,in);
              pIVar5 = (Interface *)(this->readBuffer).d.d;
              pcVar12 = (this->readBuffer).d.ptr;
              (this->readBuffer).d.d = (Data *)local_78;
              (this->readBuffer).d.ptr = (char16_t *)SStack_70._0_8_;
              qVar13 = (this->readBuffer).d.size;
              (this->readBuffer).d.size = SStack_70.remainingChars;
              local_78 = (undefined1  [8])pIVar5;
              SStack_70._0_8_ = pcVar12;
              SStack_70.remainingChars = qVar13;
              if (pIVar5 != (Interface *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&pIVar5->name)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&pIVar5->name)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                iVar1 = (((QBasicAtomicInt *)&pIVar5->name)->_q_value).super___atomic_base<int>._M_i
                ;
                UNLOCK();
joined_r0x0039c56e:
                if (iVar1 == 0) {
                  QArrayData::deallocate((QArrayData *)pIVar5,2,0x10);
                }
              }
            }
          }
          pIVar5 = (Interface *)local_98.d.d;
          pcVar12 = local_98.d.ptr;
          qVar13 = local_98.d.size;
          auVar8 = local_78;
          pcVar9 = (char16_t *)SStack_70._0_8_;
          qVar10 = SStack_70.remainingChars;
          if ((Interface *)local_b8.d.d == (Interface *)0x0) goto LAB_0039c2dc;
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
          goto LAB_0039c2dc;
          qVar13 = 1;
          data = (Interface *)local_b8.d.d;
        }
        else {
          QCoreApplication::translate
                    (&local_b8,"QXmlStream","%1 is an invalid encoding name.",(char *)0x0,-1);
          pcVar12 = (this->textBuffer).d.ptr;
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = L"";
          }
          a_01.m_size = (ulong)this_00 | 0x8000000000000000;
          a_01.field_0.m_data_utf16 = pcVar12 + lVar14;
          QString::arg_impl((QString *)local_78,&local_b8,a_01,0,(QChar)0x20);
          qVar13 = SStack_70.remainingChars;
          auVar8 = local_78;
          pcVar12 = local_98.d.ptr;
          pDVar7 = local_98.d.d;
          local_78 = (undefined1  [8])local_98.d.d;
          local_98.d.d = (Data *)auVar8;
          local_98.d.ptr = (char16_t *)SStack_70._0_8_;
          SStack_70._0_8_ = pcVar12;
          SStack_70.remainingChars = local_98.d.size;
          local_98.d.size = qVar13;
          if ((Interface *)pDVar7 != (Interface *)0x0) {
            LOCK();
            *(int *)&pDVar7->super_QArrayData = *(int *)&pDVar7->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&pDVar7->super_QArrayData == 0) {
              QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
            }
          }
          pIVar5 = (Interface *)local_98.d.d;
          pcVar12 = local_98.d.ptr;
          qVar13 = local_98.d.size;
          auVar8 = local_78;
          pcVar9 = (char16_t *)SStack_70._0_8_;
          qVar10 = SStack_70.remainingChars;
          if ((Interface *)local_b8.d.d == (Interface *)0x0) goto LAB_0039c2dc;
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          data = (Interface *)local_b8.d.d;
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
          goto LAB_0039c2dc;
LAB_0039c2cd:
          qVar13 = 2;
        }
        QArrayData::deallocate((QArrayData *)data,qVar13,0x10);
        pIVar5 = (Interface *)local_98.d.d;
        pcVar12 = local_98.d.ptr;
        qVar13 = local_98.d.size;
        auVar8 = local_78;
        pcVar9 = (char16_t *)SStack_70._0_8_;
        qVar10 = SStack_70.remainingChars;
      }
      else {
LAB_0039c0d6:
        if ((uVar2 < 2) && (uVar21 == 10)) {
          pcVar12 = (this->textBuffer).d.ptr;
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = L"";
          }
          rhs_01.m_data = pcVar12 + lVar18;
          rhs_01.m_size = 10;
          lhs_01.m_data = "standalone";
          lhs_01.m_size = 10;
          bVar11 = QtPrivate::equalStrings(lhs_01,rhs_01);
          if (!bVar11) goto LAB_0039c195;
          uVar2 = (ushort)*(undefined4 *)&this->field_0x3a8;
          *(ushort *)&this->field_0x3a8 = uVar2 | 0x2000;
          if (this_00 != (QXmlUtils *)0x2) {
            if (this_00 == (QXmlUtils *)0x3) {
              pcVar12 = (this->textBuffer).d.ptr;
              if (pcVar12 == (char16_t *)0x0) {
                pcVar12 = L"";
              }
              rhs_02.m_data = pcVar12 + lVar14;
              rhs_02.m_size = 3;
              lhs_02.m_data = "yes";
              lhs_02.m_size = 3;
              bVar11 = QtPrivate::equalStrings(lhs_02,rhs_02);
              if (bVar11) {
                *(ushort *)&this->field_0x3a8 = uVar2 | 0x2008;
                pIVar5 = (Interface *)local_98.d.d;
                pcVar12 = local_98.d.ptr;
                qVar13 = local_98.d.size;
                auVar8 = local_78;
                pcVar9 = (char16_t *)SStack_70._0_8_;
                qVar10 = SStack_70.remainingChars;
                goto LAB_0039c2dc;
              }
            }
LAB_0039c432:
            QCoreApplication::translate
                      ((QString *)local_78,"QXmlStream","Standalone accepts only yes or no.",
                       (char *)0x0,-1);
            pIVar5 = (Interface *)local_78;
            pcVar12 = (char16_t *)SStack_70._0_8_;
            qVar13 = SStack_70.remainingChars;
            auVar8 = (undefined1  [8])(Interface *)local_98.d.d;
            pcVar9 = local_98.d.ptr;
            qVar10 = local_98.d.size;
            if ((Interface *)local_98.d.d == (Interface *)0x0) goto LAB_0039c2dc;
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            iVar1 = ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            data = (Interface *)local_98.d.d;
            auVar8 = local_78;
            pcVar12 = (char16_t *)SStack_70._0_8_;
            qVar13 = SStack_70.remainingChars;
            local_78 = (undefined1  [8])local_98.d.d;
            SStack_70._0_8_ = local_98.d.ptr;
            SStack_70.remainingChars = local_98.d.size;
            goto joined_r0x0039c2c6;
          }
          pcVar12 = (this->textBuffer).d.ptr;
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = L"";
          }
          rhs_03.m_data = pcVar12 + lVar14;
          rhs_03.m_size = 2;
          lhs_03.m_data = "no";
          lhs_03.m_size = 2;
          bVar11 = QtPrivate::equalStrings(lhs_03,rhs_03);
          if (!bVar11) goto LAB_0039c432;
          *(ushort *)&this->field_0x3a8 = uVar2 & 0xfff7 | 0x2000;
          pIVar5 = (Interface *)local_98.d.d;
          pcVar12 = local_98.d.ptr;
          qVar13 = local_98.d.size;
          auVar8 = local_78;
          pcVar9 = (char16_t *)SStack_70._0_8_;
          qVar10 = SStack_70.remainingChars;
        }
        else {
LAB_0039c195:
          QCoreApplication::translate
                    (&local_d0,"QXmlStream","Invalid attribute in XML declaration: %1 = %2",
                     (char *)0x0,-1);
          pcVar12 = (this->textBuffer).d.ptr;
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = L"";
          }
          a.m_size = uVar21 | 0x8000000000000000;
          a.field_0.m_data_utf16 = pcVar12 + lVar18;
          QString::arg_impl(&local_b8,&local_d0,a,0,(QChar)0x20);
          pcVar12 = (this->textBuffer).d.ptr;
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = L"";
          }
          a_00.m_size = (ulong)this_00 | 0x8000000000000000;
          a_00.field_0.m_data_utf16 = pcVar12 + lVar14;
          QString::arg_impl((QString *)local_78,&local_b8,a_00,0,(QChar)0x20);
          qVar13 = SStack_70.remainingChars;
          auVar8 = local_78;
          pcVar12 = local_98.d.ptr;
          pDVar7 = local_98.d.d;
          local_78 = (undefined1  [8])local_98.d.d;
          local_98.d.d = (Data *)auVar8;
          local_98.d.ptr = (char16_t *)SStack_70._0_8_;
          SStack_70._0_8_ = pcVar12;
          SStack_70.remainingChars = local_98.d.size;
          local_98.d.size = qVar13;
          if ((Interface *)pDVar7 != (Interface *)0x0) {
            LOCK();
            *(int *)&pDVar7->super_QArrayData = *(int *)&pDVar7->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&pDVar7->super_QArrayData == 0) {
              QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
            }
          }
          if ((Interface *)local_b8.d.d != (Interface *)0x0) {
            LOCK();
            *(int *)&(local_b8.d.d)->super_QArrayData =
                 *(int *)&(local_b8.d.d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&(local_b8.d.d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          pIVar5 = (Interface *)local_98.d.d;
          pcVar12 = local_98.d.ptr;
          qVar13 = local_98.d.size;
          auVar8 = local_78;
          pcVar9 = (char16_t *)SStack_70._0_8_;
          qVar10 = SStack_70.remainingChars;
          if ((Interface *)local_d0.d.d != (Interface *)0x0) {
            LOCK();
            ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            iVar1 = ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            data = (Interface *)local_d0.d.d;
            auVar8 = (undefined1  [8])local_98.d.d;
joined_r0x0039c2c6:
            local_98.d.size = qVar13;
            local_98.d.ptr = pcVar12;
            local_98.d.d = (Data *)auVar8;
            pIVar5 = (Interface *)local_98.d.d;
            pcVar12 = local_98.d.ptr;
            qVar13 = local_98.d.size;
            auVar8 = local_78;
            pcVar9 = (char16_t *)SStack_70._0_8_;
            qVar10 = SStack_70.remainingChars;
            if (iVar1 == 0) goto LAB_0039c2cd;
          }
        }
      }
LAB_0039c2dc:
      SStack_70.remainingChars = qVar10;
      SStack_70._0_8_ = pcVar9;
      local_78 = auVar8;
      local_98.d.size = qVar13;
      local_98.d.ptr = pcVar12;
      local_98.d.d = (Data *)pIVar5;
      bVar11 = local_98.d.ptr == (char16_t *)0x0;
      if (!bVar11) break;
      lVar22 = lVar22 + 0x30;
      bVar6 = local_100 < lVar20;
      local_100 = local_100 + 1;
    } while (bVar6);
  }
  if (!bVar11) {
    this->error = NotWellFormedError;
    QString::operator=(&this->errorString,&local_98);
    this->type = Invalid;
  }
  (this->attributeStack).tos = -1;
  if ((Interface *)local_98.d.d != (Interface *)0x0) {
    LOCK();
    *(int *)&(local_98.d.d)->super_QArrayData = *(int *)&(local_98.d.d)->super_QArrayData + -1;
    UNLOCK();
    if (*(int *)&(local_98.d.d)->super_QArrayData == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::startDocument()
{
    QString err;
    if (documentVersion != "1.0"_L1) {
        if (documentVersion.view().contains(u' '))
            err = QXmlStream::tr("Invalid XML version string.");
        else
            err = QXmlStream::tr("Unsupported XML version.");
    }
    qsizetype n = attributeStack.size();

    /* We use this bool to ensure that the pesudo attributes are in the
     * proper order:
     *
     * [23]     XMLDecl     ::=     '<?xml' VersionInfo EncodingDecl? SDDecl? S? '?>' */

    for (qsizetype i = 0; err.isNull() && i < n; ++i) {
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef key(symString(attrib.key));
        XmlStringRef value(symString(attrib.value));

        if (prefix.isEmpty() && key == "encoding"_L1) {
            documentEncoding = value;

            if (hasStandalone)
                err = QXmlStream::tr("The standalone pseudo attribute must appear after the encoding.");
            if (!QXmlUtils::isEncName(value))
                err = QXmlStream::tr("%1 is an invalid encoding name.").arg(value);
            else {
                QByteArray enc = value.toString().toUtf8();
                if (!lockEncoding) {
                    decoder = QStringDecoder(enc.constData());
                    if (!decoder.isValid()) {
                        err = QXmlStream::tr("Encoding %1 is unsupported").arg(value);
                    } else {
                        readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));
                    }
                }
            }
        } else if (prefix.isEmpty() && key == "standalone"_L1) {
            hasStandalone = true;
            if (value == "yes"_L1)
                standalone = true;
            else if (value == "no"_L1)
                standalone = false;
            else
                err = QXmlStream::tr("Standalone accepts only yes or no.");
        } else {
            err = QXmlStream::tr("Invalid attribute in XML declaration: %1 = %2").arg(key).arg(value);
        }
    }

    if (!err.isNull())
        raiseWellFormedError(err);
    attributeStack.clear();
}